

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_style_item *
nk_draw_button(nk_command_buffer *out,nk_rect *bounds,nk_flags state,nk_style_button *style)

{
  nk_style_button *local_30;
  nk_style_item *background;
  nk_style_button *style_local;
  nk_flags state_local;
  nk_rect *bounds_local;
  nk_command_buffer *out_local;
  
  if ((state & 0x10) == 0) {
    local_30 = style;
    if ((state & 0x20) != 0) {
      local_30 = (nk_style_button *)&style->active;
    }
  }
  else {
    local_30 = (nk_style_button *)&style->hover;
  }
  if ((local_30->normal).type == NK_STYLE_ITEM_IMAGE) {
    nk_draw_image(out,*bounds,&(local_30->normal).data.image,(nk_color)0xffffffff);
  }
  else {
    nk_fill_rect(out,*bounds,style->rounding,(local_30->normal).data.color);
    nk_stroke_rect(out,*bounds,style->rounding,style->border,style->border_color);
  }
  return &local_30->normal;
}

Assistant:

NK_LIB const struct nk_style_item*
nk_draw_button(struct nk_command_buffer *out,
    const struct nk_rect *bounds, nk_flags state,
    const struct nk_style_button *style)
{
    const struct nk_style_item *background;
    if (state & NK_WIDGET_STATE_HOVER)
        background = &style->hover;
    else if (state & NK_WIDGET_STATE_ACTIVED)
        background = &style->active;
    else background = &style->normal;

    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(out, *bounds, &background->data.image, nk_white);
    } else {
        nk_fill_rect(out, *bounds, style->rounding, background->data.color);
        nk_stroke_rect(out, *bounds, style->rounding, style->border, style->border_color);
    }
    return background;
}